

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmse.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  long lVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  value_type_conflict *__val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t sVar7;
  char *__s_00;
  uint read_size;
  string *psVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  int vector_length;
  vector<double,_std::allocator<double>_> mean_squared_error;
  double magic_number;
  StatisticsAccumulation accumulation;
  vector<double,_std::allocator<double>_> data2;
  vector<double,_std::allocator<double>_> data1;
  ostringstream error_message_6;
  ifstream ifs1;
  Buffer buffer_for_mean_squared_error;
  ifstream ifs2;
  Buffer buffer_for_mean;
  option long_options [2];
  uint local_7b4;
  string local_7b0;
  allocator_type local_789;
  vector<double,_std::allocator<double>_> local_788;
  ulong local_768;
  string *local_760;
  ulong local_758;
  double local_750;
  StatisticsAccumulation local_748;
  vector<double,_std::allocator<double>_> local_730;
  vector<double,_std::allocator<double>_> local_718;
  string local_700 [3];
  ios_base local_690 [264];
  string local_588;
  byte abStack_568 [80];
  ios_base local_518 [408];
  Buffer local_380;
  string local_300;
  byte abStack_2e0 [80];
  ios_base local_290 [408];
  Buffer local_f8;
  option local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_7b4 = 0xffffffff;
  local_750 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.flag = (int *)0x0;
  local_78.val = 1000;
  local_78._28_4_ = 0;
  local_78.name = "magic";
  local_78.has_arg = 1;
  local_78._12_4_ = 0;
  local_768 = 0;
  local_758 = 0;
  do {
    while( true ) {
      iVar5 = ya_getopt_long_only(argc,argv,"l:m:fh",&local_78,(int *)0x0);
      if (7 < iVar5 - 0x66U) break;
      switch(iVar5) {
      case 0x66:
        local_768 = CONCAT71((int7)((ulong)((long)&switchD_0010376f::switchdataD_0010d028 +
                                           (long)(int)(&switchD_0010376f::switchdataD_0010d028)
                                                      [iVar5 - 0x66U]) >> 8),1);
        break;
      default:
switchD_0010376f_caseD_67:
        anon_unknown.dwarf_340a::PrintUsage((ostream *)&std::cerr);
        return 1;
      case 0x68:
        anon_unknown.dwarf_340a::PrintUsage((ostream *)&std::cout);
        return 0;
      case 0x6c:
        std::__cxx11::string::string((string *)&local_588,ya_optarg,(allocator *)&local_300);
        bVar4 = sptk::ConvertStringToInteger(&local_588,(int *)&local_7b4);
        bVar2 = (int)local_7b4 < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p);
        }
        if (!bVar4 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_588);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_588,
                     "The argument for the -l option must be a positive integer",0x39);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"rmse","");
          sptk::PrintErrorMessage(&local_300,(ostringstream *)&local_588);
          goto LAB_00103b3a;
        }
        break;
      case 0x6d:
        std::__cxx11::string::string((string *)&local_588,ya_optarg,(allocator *)&local_300);
        bVar2 = sptk::ConvertStringToInteger(&local_588,(int *)&local_7b4);
        bVar4 = (int)local_7b4 < 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p);
        }
        if (!bVar2 || bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_588);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_588,"The argument for the -m option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_588,"non-negative integer",0x14);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"rmse","");
          sptk::PrintErrorMessage(&local_300,(ostringstream *)&local_588);
          goto LAB_00103b3a;
        }
        local_7b4 = local_7b4 + 1;
      }
    }
    if (iVar5 == -1) {
      if (argc - ya_optind == 1) {
        lVar1 = (long)argc + -1;
        __s_00 = (char *)0x0;
      }
      else {
        if (argc - ya_optind != 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_588);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_588,"Just two input files, file1, and infile, are required",
                     0x35);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"rmse","");
          sptk::PrintErrorMessage(&local_300,(ostringstream *)&local_588);
          goto LAB_00103b3a;
        }
        lVar1 = (long)argc + -2;
        __s_00 = argv[(long)argc + -1];
      }
      __s = argv[lVar1];
      bVar2 = sptk::SetBinaryMode();
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_588);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_588,"Cannot set translation mode",0x1b);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"rmse","");
        sptk::PrintErrorMessage(&local_300,(ostringstream *)&local_588);
        goto LAB_00103b3a;
      }
      std::ifstream::ifstream(&local_588);
      std::ifstream::open((char *)&local_588,(_Ios_Openmode)__s);
      if ((abStack_568[*(long *)(local_588._M_dataplus._M_p + -0x18)] & 5) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_300);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_300,"Cannot open file ",0x11);
        if (__s == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffff838 +
                          (int)*(undefined8 *)(local_300._M_dataplus._M_p + -0x18) + 0x4c8);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_300,__s,sVar7);
        }
        local_700[0]._M_dataplus._M_p = (pointer)&local_700[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"rmse","");
        sptk::PrintErrorMessage(local_700,(ostringstream *)&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700[0]._M_dataplus._M_p != &local_700[0].field_2) {
          operator_delete(local_700[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_300);
        std::ios_base::~ios_base(local_290);
        iVar5 = 1;
        goto LAB_00104329;
      }
      psVar8 = &local_300;
      std::ifstream::ifstream(psVar8);
      if ((__s_00 != (char *)0x0) &&
         (std::ifstream::open((char *)&local_300,(_Ios_Openmode)__s_00),
         (abStack_2e0[*(long *)(local_300._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_700,"Cannot open file ",0x11);
        sVar7 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_700,__s_00,sVar7);
        local_380._vptr_Buffer = (_func_int **)&local_380.first_order_statistics_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"rmse","");
        sptk::PrintErrorMessage((string *)&local_380,(ostringstream *)local_700);
        if ((vector<double,_std::allocator<double>_> *)local_380._vptr_Buffer !=
            &local_380.first_order_statistics_) {
          operator_delete(local_380._vptr_Buffer);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        std::ios_base::~ios_base(local_690);
        iVar5 = 1;
        goto LAB_0010431c;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        psVar8 = (string *)&std::cin;
      }
      sptk::StatisticsAccumulation::StatisticsAccumulation(&local_748,0,1,false,false);
      sptk::StatisticsAccumulation::Buffer::Buffer(&local_380);
      sptk::StatisticsAccumulation::Buffer::Buffer(&local_f8);
      if (local_748.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_700,"Failed to initialize StatisticsAccumulation",0x2b);
        local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
        sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
          operator_delete(local_7b0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        std::ios_base::~ios_base(local_690);
        iVar5 = 1;
        goto LAB_00104302;
      }
      read_size = 1;
      if (local_7b4 != 0xffffffff) {
        read_size = local_7b4;
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&local_718,(long)(int)read_size,(allocator_type *)local_700);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_730,(long)(int)read_size,(allocator_type *)local_700);
      iVar5 = 0;
      local_760 = psVar8;
      break;
    }
    if (iVar5 != 1000) goto switchD_0010376f_caseD_67;
    std::__cxx11::string::string((string *)&local_588,ya_optarg,(allocator *)&local_300);
    bVar2 = sptk::ConvertStringToDouble(&local_588,&local_750);
    paVar6 = &local_588.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != paVar6) {
      operator_delete(local_588._M_dataplus._M_p);
      paVar6 = extraout_RAX;
    }
    local_758 = CONCAT71((int7)((ulong)paVar6 >> 8),1);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_588);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_588,"The argument for the -magic option must be numeric",0x32);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"rmse","");
      sptk::PrintErrorMessage(&local_300,(ostringstream *)&local_588);
LAB_00103b3a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_588);
      std::ios_base::~ios_base(local_518);
      return 1;
    }
  } while( true );
  do {
    do {
      psVar8 = local_760;
      bVar2 = sptk::ReadStream<double>
                        (false,0,0,read_size,&local_718,(istream *)&local_588,(int *)0x0);
      if ((!bVar2) ||
         (bVar2 = sptk::ReadStream<double>
                            (false,0,0,read_size,&local_730,(istream *)psVar8,(int *)0x0), !bVar2))
      {
        if (local_7b4 == 0xffffffff) {
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(8);
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
          *local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start = 0.0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          bVar2 = sptk::StatisticsAccumulation::GetMean(&local_748,&local_380,&local_788);
          if (bVar2) {
            dVar12 = *local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (dVar12 < 0.0) {
              dVar12 = sqrt(dVar12);
            }
            else {
              dVar12 = SQRT(dVar12);
            }
            bVar4 = sptk::WriteStream<double>(dVar12,(ostream *)&std::cout);
            bVar2 = true;
            if (bVar4) goto LAB_00104583;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_700,"Failed to write root mean squared error",0x27);
            local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
            sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
LAB_00104611:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) goto LAB_00104555;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_700,"Failed to get mean squared error",0x20);
            local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
            sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
LAB_0010454b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
LAB_00104555:
              operator_delete(local_7b0._M_dataplus._M_p);
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
          std::ios_base::~ios_base(local_690);
          iVar5 = 1;
          bVar2 = false;
LAB_00104583:
          if (local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (double *)0x0) {
            operator_delete(local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (!bVar2) goto LAB_001042de;
        }
        else if ((local_768 & 1) == 0) {
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(8);
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
          *local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start = 0.0;
          local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          bVar2 = sptk::StatisticsAccumulation::GetMean(&local_748,&local_f8,&local_788);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_700,"Failed to get root mean squared error",0x25);
            local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
            sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
            goto LAB_0010454b;
          }
          bVar4 = sptk::WriteStream<double>
                            (*local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,(ostream *)&std::cout);
          bVar2 = true;
          if (!bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_700,"Failed to write root mean squared error",0x27);
            local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
            sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
            goto LAB_00104611;
          }
          goto LAB_00104583;
        }
        iVar5 = 0;
        goto LAB_001042de;
      }
      if (0 < (int)read_size) {
        uVar9 = 0;
        do {
          if ((local_758 & 1) == 0) {
            uVar10 = SUB84(local_718.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar9],0);
            uVar11 = (undefined4)
                     ((ulong)local_718.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar9] >> 0x20);
            dVar12 = local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
LAB_00103e87:
            dVar12 = (double)CONCAT44(uVar11,uVar10) - dVar12;
            local_7b0._M_dataplus._M_p = (pointer)(dVar12 * dVar12);
            __l._M_len = 1;
            __l._M_array = (iterator)&local_7b0;
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)local_700,__l,
                       (allocator_type *)&local_788);
            bVar2 = sptk::StatisticsAccumulation::Run
                              (&local_748,(vector<double,_std::allocator<double>_> *)local_700,
                               &local_380);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_700[0]._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_700[0]._M_dataplus._M_p);
            }
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_700,"Failed to accumulate statistics",0x1f);
              local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
              sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
                operator_delete(local_7b0._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
              std::ios_base::~ios_base(local_690);
              iVar5 = 1;
              goto LAB_001042de;
            }
          }
          else {
            dVar12 = local_718.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
            uVar10 = SUB84(dVar12,0);
            uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
            if ((local_750 != dVar12) || (NAN(local_750) || NAN(dVar12))) {
              dVar12 = local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9];
              if ((local_750 != dVar12) || (NAN(local_750) || NAN(dVar12))) goto LAB_00103e87;
            }
          }
          uVar9 = uVar9 + 1;
        } while (read_size != uVar9);
      }
    } while (local_7b4 == 0xffffffff);
    local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(8);
    local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
    *local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    bVar2 = sptk::StatisticsAccumulation::GetMean(&local_748,&local_380,&local_788);
    if (bVar2) {
      dVar12 = *local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (dVar12 < 0.0) {
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)sqrt(dVar12);
      }
      else {
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)SQRT(dVar12);
      }
      if ((local_768 & 1) == 0) {
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&local_7b0;
        local_7b0._M_dataplus._M_p = (pointer)paVar6;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_700,__l_00,&local_789);
        bVar2 = sptk::StatisticsAccumulation::Run
                          (&local_748,(vector<double,_std::allocator<double>_> *)local_700,&local_f8
                          );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700[0]._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_700[0]._M_dataplus._M_p);
        }
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_700,"Failed to accumulate statistics",0x1f);
          local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
          sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
          goto LAB_0010413f;
        }
      }
      else {
        bVar2 = sptk::WriteStream<double>((double)paVar6,(ostream *)&std::cout);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_700,"Failed to write root mean squared error",0x27);
          local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
          sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
LAB_0010413f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) goto LAB_00103fcc;
          goto LAB_00103fd1;
        }
      }
      bVar2 = true;
      sptk::StatisticsAccumulation::Clear(&local_748,&local_380);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_700,"Failed to get mean squared error",0x20);
      local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rmse","");
      sptk::PrintErrorMessage(&local_7b0,(ostringstream *)local_700);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
LAB_00103fcc:
        operator_delete(local_7b0._M_dataplus._M_p);
      }
LAB_00103fd1:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
      std::ios_base::~ios_base(local_690);
      iVar5 = 1;
      bVar2 = false;
    }
    if (local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (bVar2);
LAB_001042de:
  if (local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_718.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_718.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00104302:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&local_f8);
  sptk::StatisticsAccumulation::Buffer::~Buffer(&local_380);
LAB_0010431c:
  std::ifstream::~ifstream(&local_300);
LAB_00104329:
  std::ifstream::~ifstream(&local_588);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kMagicNumberForEndOfFile);
  double magic_number(0.0);
  bool use_magic_number(kDefaultUseMagicNumber);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:fh", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message << "The argument for the -magic option must be numeric";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        use_magic_number = true;
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file1(NULL);
  const char* input_file2(NULL);
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    input_file1 = argv[argc - 2];
    input_file2 = argv[argc - 1];
  } else if (1 == num_input_files) {
    input_file1 = argv[argc - 1];
    input_file2 = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1, and infile, are required";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(input_file1, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << input_file1;
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }
  std::istream& input_stream1(ifs1);

  std::ifstream ifs2;
  if (NULL != input_file2) {
    ifs2.open(input_file2, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file2;
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }
  std::istream& input_stream2(ifs2.is_open() ? ifs2 : std::cin);

  sptk::StatisticsAccumulation accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer_for_mean_squared_error;
  sptk::StatisticsAccumulation::Buffer buffer_for_mean;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  const int read_size(
      kMagicNumberForEndOfFile == vector_length ? 1 : vector_length);
  std::vector<double> data1(read_size);
  std::vector<double> data2(read_size);
  while (
      sptk::ReadStream(false, 0, 0, read_size, &data1, &input_stream1, NULL) &&
      sptk::ReadStream(false, 0, 0, read_size, &data2, &input_stream2, NULL)) {
    for (int i(0); i < read_size; ++i) {
      if (!use_magic_number ||
          (magic_number != data1[i] && magic_number != data2[i])) {
        const double error(data1[i] - data2[i]);
        if (!accumulation.Run(std::vector<double>{error * error},
                              &buffer_for_mean_squared_error)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
    }

    if (kMagicNumberForEndOfFile != vector_length) {
      std::vector<double> mean_squared_error(1);
      if (!accumulation.GetMean(buffer_for_mean_squared_error,
                                &mean_squared_error)) {
        std::ostringstream error_message;
        error_message << "Failed to get mean squared error";
        sptk::PrintErrorMessage("rmse", error_message);
        return 1;
      }

      const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
      if (output_frame_by_frame) {
        if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write root mean squared error";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      } else {
        if (!accumulation.Run(std::vector<double>{root_mean_squared_error},
                              &buffer_for_mean)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
      accumulation.Clear(&buffer_for_mean_squared_error);
    }
  }

  if (kMagicNumberForEndOfFile == vector_length) {
    std::vector<double> mean_squared_error(1);
    if (!accumulation.GetMean(buffer_for_mean_squared_error,
                              &mean_squared_error)) {
      std::ostringstream error_message;
      error_message << "Failed to get mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
    if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  } else if (!output_frame_by_frame) {
    std::vector<double> mean(1);
    if (!accumulation.GetMean(buffer_for_mean, &mean)) {
      std::ostringstream error_message;
      error_message << "Failed to get root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    if (!sptk::WriteStream(mean[0], &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }

  return 0;
}